

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::GetLocalObjectFiles
          (cmLocalUnixMakefileGenerator3 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
          *localObjectFiles)

{
  cmMakefile *this_00;
  cmSourceFile *source;
  cmTarget *t;
  pointer this_01;
  bool bVar1;
  int iVar2;
  cmGeneratorTargetsType *pcVar3;
  pointer ppVar4;
  char *pcVar5;
  reference ppcVar6;
  mapped_type *this_02;
  string local_1f0;
  LocalObjectEntry local_1d0;
  mapped_type *local_1a8;
  LocalObjectInfo *info;
  undefined1 local_180 [8];
  string objectName;
  bool hasSourceExtension;
  cmSourceFile *sf;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_148;
  iterator si;
  undefined1 local_120 [8];
  string dir;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  cmGeneratorTarget *gt;
  _Self local_90;
  iterator ti;
  undefined1 local_78 [8];
  cmGeneratorTargetsType targets;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  *localObjectFiles_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&targets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pcVar3 = cmMakefile::GetGeneratorTargets((this->super_cmLocalGenerator).Makefile);
  std::
  map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::map((map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
         *)local_78,pcVar3);
  local_90._M_node =
       (_Base_ptr)
       std::
       map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
       ::begin((map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
                *)local_78);
  while( true ) {
    gt = (cmGeneratorTarget *)
         std::
         map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
         ::end((map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
                *)local_78);
    bVar1 = std::operator!=(&local_90,(_Self *)&gt);
    if (!bVar1) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>::
             operator->(&local_90);
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar4->second;
    iVar2 = cmGeneratorTarget::GetType
                      ((cmGeneratorTarget *)
                       objectSources.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar2 != 7) {
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_b8);
      this_01 = objectSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      this_00 = (this->super_cmLocalGenerator).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f8,"CMAKE_BUILD_TYPE",
                 (allocator *)(dir.field_2._M_local_buf + 0xf));
      pcVar5 = cmMakefile::GetSafeDefinition(this_00,&local_f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d8,pcVar5,(allocator *)(dir.field_2._M_local_buf + 0xe));
      cmGeneratorTarget::GetObjectSources
                ((cmGeneratorTarget *)this_01,
                 (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_b8,
                 &local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xe));
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string((string *)local_120);
      pcVar5 = cmMakefile::GetCurrentBinaryDirectory
                         ((cmMakefile *)
                          objectSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[1]);
      std::__cxx11::string::operator+=((string *)local_120,pcVar5);
      std::__cxx11::string::operator+=((string *)local_120,"/");
      (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                (&si,this,*objectSources.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator+=((string *)local_120,(string *)&si);
      std::__cxx11::string::~string((string *)&si);
      std::__cxx11::string::operator+=((string *)local_120,"/");
      local_148._M_current =
           (cmSourceFile **)
           std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_b8);
      while( true ) {
        sf = (cmSourceFile *)
             std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        local_b8);
        bVar1 = __gnu_cxx::operator!=
                          (&local_148,
                           (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                            *)&sf);
        if (!bVar1) break;
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                  ::operator*(&local_148);
        source = *ppcVar6;
        objectName.field_2._M_local_buf[0xf] = '\x01';
        cmLocalGenerator::GetObjectFileNameWithoutTarget
                  ((string *)local_180,&this->super_cmLocalGenerator,source,(string *)local_120,
                   (bool *)(objectName.field_2._M_local_buf + 0xf));
        pcVar5 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar5);
        if (bVar1) {
          cmsys::SystemTools::GetFilenameName((string *)&info,(string *)local_180);
          std::__cxx11::string::operator=((string *)local_180,(string *)&info);
          std::__cxx11::string::~string((string *)&info);
        }
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                  ::operator[](localObjectFiles,(key_type *)local_180);
        this_02->HasSourceExtension = (bool)(objectName.field_2._M_local_buf[0xf] & 1);
        t = (cmTarget *)
            *objectSources.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_1a8 = this_02;
        cmSourceFile::GetLanguage_abi_cxx11_(&local_1f0,source);
        LocalObjectEntry::LocalObjectEntry(&local_1d0,t,&local_1f0);
        std::
        vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
        ::push_back(&this_02->
                     super_vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                    ,&local_1d0);
        LocalObjectEntry::~LocalObjectEntry(&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)local_180);
        __gnu_cxx::
        __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
        ::operator++(&local_148);
      }
      std::__cxx11::string::~string((string *)local_120);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_b8);
    }
    std::_Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>::operator++
              (&local_90);
  }
  std::
  map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~map((map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *)local_78);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&targets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::
GetLocalObjectFiles(std::map<std::string, LocalObjectInfo> &localObjectFiles)
{
  std::set<std::string> emitted;
  cmGeneratorTargetsType targets = this->Makefile->GetGeneratorTargets();
  for(cmGeneratorTargetsType::iterator ti = targets.begin();
      ti != targets.end(); ++ti)
    {
    cmGeneratorTarget* gt = ti->second;
    if (gt->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(objectSources, this->Makefile
                                    ->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    // Compute full path to object file directory for this target.
    std::string dir;
    dir += gt->Makefile->GetCurrentBinaryDirectory();
    dir += "/";
    dir += this->GetTargetDirectory(*gt->Target);
    dir += "/";
    // Compute the name of each object file.
    for(std::vector<cmSourceFile const*>::iterator
          si = objectSources.begin();
        si != objectSources.end(); ++si)
      {
      cmSourceFile const* sf = *si;
      bool hasSourceExtension = true;
      std::string objectName = this->GetObjectFileNameWithoutTarget(*sf,
                                                                    dir,
                                                        &hasSourceExtension);
      if(cmSystemTools::FileIsFullPath(objectName.c_str()))
        {
        objectName = cmSystemTools::GetFilenameName(objectName);
        }
      LocalObjectInfo& info = localObjectFiles[objectName];
      info.HasSourceExtension = hasSourceExtension;
      info.push_back(LocalObjectEntry(gt->Target, sf->GetLanguage()));
      }
    }
}